

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_diag.c
# Opt level: O3

rt_function_error_t exec_matrix_diag(rt_function_t *f)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  plVar2 = (long *)f->local_context;
  lVar6 = plVar2[2];
  if (0 < (long)(int)lVar6) {
    lVar3 = *(long *)(*plVar2 + 0x18);
    lVar4 = *(long *)(plVar2[3] + 0x18);
    uVar1 = *(uint *)((long)plVar2 + 0x2c);
    uVar9 = (ulong)uVar1;
    uVar7 = 0;
    lVar10 = lVar4;
    do {
      if (0 < (int)uVar1) {
        uVar5 = (uVar7 & 0xffffffff) % uVar9;
        uVar8 = 0;
        do {
          if (uVar5 == uVar8) {
            *(undefined4 *)(lVar4 + uVar7 * uVar9 * 4 + uVar5 * 4) =
                 *(undefined4 *)(lVar3 + uVar7 * 4);
          }
          else {
            *(undefined4 *)(lVar10 + uVar8 * 4) = 0;
          }
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      uVar7 = uVar7 + 1;
      lVar10 = lVar10 + uVar9 * 4;
    } while (uVar7 != (long)(int)lVar6);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_matrix_diag(rt_function_t *f) {
  matrix_diag_local_context_t *context =
      (matrix_diag_local_context_t *)(f->local_context);
  float *x = (float *)(context->input->data);
  float *y = (float *)(context->output->data);

  int i, j;
  for (i = 0; i < context->input_size; i++) {
    for (j = 0; j < context->last_ndim; j++) {
      if (i % context->last_ndim == j) {
        y[i * context->last_ndim + j] = x[i];
      } else {
        y[i * context->last_ndim + j] = 0.;
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}